

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFCheckpointDirectory(TIFF *tif)

{
  int iVar1;
  toff_t off;
  
  if ((tif->tif_dir).td_stripoffset_p == (uint64_t *)0x0) {
    TIFFSetupStrips(tif);
  }
  iVar1 = TIFFWriteDirectorySec(tif,1,0,(uint64_t *)0x0);
  off = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
  TIFFSetWriteOffset(tif,off);
  return iVar1;
}

Assistant:

int TIFFCheckpointDirectory(TIFF *tif)
{
    int rc;
    /* Setup the strips arrays, if they haven't already been. */
    if (tif->tif_dir.td_stripoffset_p == NULL)
        (void)TIFFSetupStrips(tif);
    rc = TIFFWriteDirectorySec(tif, TRUE, FALSE, NULL);
    (void)TIFFSetWriteOffset(tif, TIFFSeekFile(tif, 0, SEEK_END));
    return rc;
}